

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Bytes __thiscall
Omega_h::eq_each<signed_char>(Omega_h *this,Read<signed_char> *a,Read<signed_char> *b)

{
  void *extraout_RDX;
  Bytes BVar1;
  Write<signed_char> local_120;
  undefined1 local_110 [8];
  type f;
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [8];
  Write<signed_char> c;
  Read<signed_char> *b_local;
  Read<signed_char> *a_local;
  LO local_40;
  LO local_30;
  int local_20;
  int local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = (int)((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (int)((ulong)(a->write_).shared_alloc_.alloc >> 3);
  }
  if (((ulong)(b->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = (int)((b->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (int)((ulong)(b->write_).shared_alloc_.alloc >> 3);
  }
  c.shared_alloc_.direct_ptr = b;
  if (local_10 == local_20) {
    if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
      local_30 = (LO)((a->write_).shared_alloc_.alloc)->size;
    }
    else {
      local_30 = (LO)((ulong)(a->write_).shared_alloc_.alloc >> 3);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"",&local_c9);
    Write<signed_char>::Write((Write<signed_char> *)local_a8,local_30,(string *)local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    Write<signed_char>::Write((Write<signed_char> *)local_110,(Write<signed_char> *)local_a8);
    Read<signed_char>::Read((Read<signed_char> *)&f.c.shared_alloc_.direct_ptr,a);
    Read<signed_char>::Read((Read<signed_char> *)&f.a.write_.shared_alloc_.direct_ptr,b);
    if (((ulong)local_a8 & 1) == 0) {
      local_40 = (LO)*(size_t *)local_a8;
    }
    else {
      local_40 = (LO)((ulong)local_a8 >> 3);
    }
    parallel_for<Omega_h::eq_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::_lambda(int)_1_>
              (local_40,(type *)local_110,"eq_each");
    Write<signed_char>::Write(&local_120,(Write<signed_char> *)local_a8);
    Read<signed_char>::Read((Read<signed_char> *)this,&local_120);
    Write<signed_char>::~Write(&local_120);
    eq_each<signed_char>(Omega_h::Read<signed_char>,Omega_h::Read<signed_char>)::{lambda(int)#1}::
    ~Read((_lambda_int__1_ *)local_110);
    Write<signed_char>::~Write((Write<signed_char> *)local_a8);
    BVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
    BVar1.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Bytes)BVar1.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a.size() == b.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_array_ops.cpp"
       ,0x10a);
}

Assistant:

Bytes eq_each(Read<T> a, Read<T> b) {
  OMEGA_H_CHECK(a.size() == b.size());
  Write<I8> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = (a[i] == b[i]); };
  parallel_for(c.size(), f, "eq_each");
  return c;
}